

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void translateColumnToCopy(Parse *pParse,int iStart,int iTabCur,int iRegister,int iAutoidxCur)

{
  int iVar1;
  Vdbe *pVVar2;
  Op *pOVar3;
  
  pVVar2 = pParse->pVdbe;
  if (pVVar2->db->mallocFailed == '\0') {
    pOVar3 = pVVar2->aOp + iStart;
  }
  else {
    pOVar3 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  if (pParse->db->mallocFailed == '\0') {
    iVar1 = pVVar2->nOp;
    for (; iStart < iVar1; iStart = iStart + 1) {
      if (pOVar3->p1 == iTabCur) {
        if (pOVar3->opcode == 0x87) {
          pOVar3->opcode = '~';
          pOVar3->p1 = iAutoidxCur;
        }
        else if (pOVar3->opcode == '^') {
          pOVar3->opcode = 'P';
          pOVar3->p1 = pOVar3->p2 + iRegister;
          pOVar3->p2 = pOVar3->p3;
          pOVar3->p3 = 0;
          pOVar3->p5 = 2;
        }
      }
      pOVar3 = pOVar3 + 1;
    }
  }
  return;
}

Assistant:

static void translateColumnToCopy(
  Parse *pParse,      /* Parsing context */
  int iStart,         /* Translate from this opcode to the end */
  int iTabCur,        /* OP_Column/OP_Rowid references to this table */
  int iRegister,      /* The first column is in this register */
  int iAutoidxCur     /* If non-zero, cursor of autoindex being generated */
){
  Vdbe *v = pParse->pVdbe;
  VdbeOp *pOp = sqlite3VdbeGetOp(v, iStart);
  int iEnd = sqlite3VdbeCurrentAddr(v);
  if( pParse->db->mallocFailed ) return;
#ifdef SQLITE_DEBUG
  if( pParse->db->flags & SQLITE_VdbeAddopTrace ){
    printf("CHECKING for column-to-copy on cursor %d for %d..%d\n",
            iTabCur, iStart, iEnd);
  }
#endif
  for(; iStart<iEnd; iStart++, pOp++){
    if( pOp->p1!=iTabCur ) continue;
    if( pOp->opcode==OP_Column ){
#ifdef SQLITE_DEBUG
      if( pParse->db->flags & SQLITE_VdbeAddopTrace ){
        printf("TRANSLATE OP_Column to OP_Copy at %d\n", iStart);
      }
#endif
      pOp->opcode = OP_Copy;
      pOp->p1 = pOp->p2 + iRegister;
      pOp->p2 = pOp->p3;
      pOp->p3 = 0;
      pOp->p5 = 2;  /* Cause the MEM_Subtype flag to be cleared */
    }else if( pOp->opcode==OP_Rowid ){
#ifdef SQLITE_DEBUG
      if( pParse->db->flags & SQLITE_VdbeAddopTrace ){
        printf("TRANSLATE OP_Rowid to OP_Sequence at %d\n", iStart);
      }
#endif
      pOp->opcode = OP_Sequence;
      pOp->p1 = iAutoidxCur;
#ifdef SQLITE_ALLOW_ROWID_IN_VIEW
      if( iAutoidxCur==0 ){
        pOp->opcode = OP_Null;
        pOp->p3 = 0;
      }
#endif
    }
  }
}